

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::CallErrorHandler(SQVM *this,SQObjectPtr *error)

{
  SQFunctionProto *this_00;
  long lVar1;
  SQInteger SVar2;
  long in_RSI;
  SQObjectPtr *in_RDI;
  SQBool in_stack_00000010;
  SQObjectPtr *in_stack_00000018;
  SQObjectPtr out;
  SQInteger line;
  SQChar *errStr_1;
  SQChar *src;
  SQFunctionProto *func;
  SQChar *errStr;
  _HashNode **local_68;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  SQVM *in_stack_ffffffffffffffb0;
  
  if (in_RDI[9].super_SQObject._unVal.pTable != (SQTable *)0x0) {
    if (*(int *)&((in_RDI[0x11].super_SQObject._unVal.pTable)->super_SQDelegable).
                 super_SQCollectable.super_SQRefCounted._weakref == 0x8000200) {
      (*(code *)in_RDI[9].super_SQObject._unVal)(in_RDI,0x65,"",0,*(long *)(in_RSI + 8) + 0x38);
    }
    else {
      this_00 = (SQFunctionProto *)
                ((in_RDI[0x11].super_SQObject._unVal.pString)->_sharedstate->_refs_table)._slotused;
      if (this_00 != (SQFunctionProto *)0x0) {
        if ((this_00->_sourcename).super_SQObject._type == OT_STRING) {
          local_68 = &((this_00->_sourcename).super_SQObject._unVal.pTable)->_firstfree;
        }
        else {
          local_68 = (_HashNode **)0x0;
        }
        lVar1 = *(long *)(in_RSI + 8);
        SVar2 = SQFunctionProto::GetLine
                          (this_00,(SQInstruction *)
                                   ((in_RDI[0x11].super_SQObject._unVal.pTable)->super_SQDelegable).
                                   super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted,
                           (int *)0x0,(bool *)0x0);
        (*(code *)in_RDI[9].super_SQObject._unVal)(in_RDI,0x65,local_68,SVar2,lVar1 + 0x38);
      }
    }
  }
  if (in_RDI[8].super_SQObject._type != OT_NULL) {
    ::SQObjectPtr::SQObjectPtr(in_RDI);
    Push(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    Push(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    Call((SQVM *)errStr_1,(SQObjectPtr *)line,out.super_SQObject._unVal.nInteger,
         out.super_SQObject._0_8_,in_stack_00000018,in_stack_00000010);
    Pop(in_stack_ffffffffffffffb0,(SQInteger)in_stack_ffffffffffffffa8);
    ::SQObjectPtr::~SQObjectPtr(in_RDI);
  }
  return;
}

Assistant:

void SQVM::CallErrorHandler(SQObjectPtr &error)
{
  if (_debughook_native)
  {
    if (ci->_closure._type == OT_NATIVECLOSURE)
    {
      const SQChar *errStr = _stringval(error);
      _debughook_native(this, _SC('e'), _SC(""), 0, errStr);
    }
    else
    {
      SQFunctionProto *func = _closure(ci->_closure)->_function;
      if (func)
      {
        const SQChar *src = sq_type(func->_sourcename) == OT_STRING ? _stringval(func->_sourcename) : NULL;
        const SQChar *errStr = _stringval(error);
        SQInteger line = func->GetLine(ci->_ip);
        _debughook_native(this, _SC('e'), src, line, errStr);
      }
    }
  }

    if(sq_type(_errorhandler) != OT_NULL) {
        SQObjectPtr out;
        assert(_top+2 <= _stack.size());
        Push(_roottable); Push(error);
        Call(_errorhandler, 2, _top-2, out,SQFalse);
        Pop(2);
    }
}